

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlmodelserialiser.cpp
# Opt level: O1

bool __thiscall HtmlModelSerialiser::saveModel(HtmlModelSerialiser *this,QIODevice *destination)

{
  HtmlModelSerialiserPrivate *this_00;
  char cVar1;
  bool bVar2;
  QXmlStreamWriter writer;
  QXmlStreamWriter local_20 [8];
  
  if (((destination != (QIODevice *)0x0) &&
      (((cVar1 = QIODevice::isOpen(), cVar1 != '\0' ||
        (cVar1 = (**(code **)(*(long *)destination + 0x68))(destination,2), cVar1 != '\0')) &&
       (cVar1 = QIODevice::isWritable(), cVar1 != '\0')))) &&
     (this_00 = (HtmlModelSerialiserPrivate *)
                (this->super_AbstractStringSerialiser).super_AbstractModelSerialiser.d_ptr.d,
     (this_00->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
     m_constModel != (QAbstractItemModel *)0x0)) {
    QXmlStreamWriter::QXmlStreamWriter(local_20,destination);
    bVar2 = HtmlModelSerialiserPrivate::writeHtml(this_00,local_20);
    QXmlStreamWriter::~QXmlStreamWriter(local_20);
    return bVar2;
  }
  return false;
}

Assistant:

bool HtmlModelSerialiser::saveModel(QIODevice *destination) const
{
    if (!destination)
        return false;
    if (!destination->isOpen()) {
        if (!destination->open(QIODevice::WriteOnly))
            return false;
    }
    if (!destination->isWritable())
        return false;
    Q_D(const HtmlModelSerialiser);

    if (!d->m_constModel)
        return false;
    QXmlStreamWriter writer(destination);
#if (QT_VERSION < QT_VERSION_CHECK(6, 0, 0))
    writer.setCodec(textCodec());
#endif
    return d->writeHtml(writer);
}